

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,false>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar2;
  long lVar3;
  byte bVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  reference pvVar8;
  uint64_t uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  long lVar11;
  long lVar12;
  uint64_t *puVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  long lVar20;
  size_type __n;
  ulong uVar21;
  INCREMENT_TYPE *data_1;
  TYPE *data;
  RangeInfoStruct<duckdb::NumericRangeInfo,_false> info;
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  DataChunk *local_138;
  long *local_130;
  long local_128;
  long local_120;
  unsigned_long local_118;
  undefined1 local_110 [16];
  long local_100;
  long *local_78;
  long local_70;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RangeInfoStruct
            ((RangeInfoStruct<duckdb::NumericRangeInfo,_false> *)local_110,args);
  uVar18 = 1;
  local_138 = args;
  if (*(long *)(args + 8) != *(long *)args) {
    __n = 0;
    do {
      pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,__n);
      if (*pvVar8 != (value_type)0x2) {
        uVar18 = *(ulong *)(args + 0x18);
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  lVar12 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (uVar18 == 0) {
    uVar21 = 0;
  }
  else {
    puVar13 = (uint64_t *)(lVar12 + 8);
    uVar19 = 0;
    uVar21 = 0;
    do {
      bVar7 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RowIsValid
                        ((RangeInfoStruct<duckdb::NumericRangeInfo,_false> *)local_110,uVar19);
      if (bVar7) {
        puVar13[-1] = uVar21;
        uVar9 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::ListLength
                          ((RangeInfoStruct<duckdb::NumericRangeInfo,_false> *)local_110,uVar19);
        *puVar13 = uVar9;
        uVar21 = uVar21 + uVar9;
      }
      else {
        if (*(long *)(result + 0x28) == 0) {
          local_118 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_148,&local_118);
          p_Var6 = p_Stack_140;
          uVar5 = local_148;
          local_148 = 0;
          p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar5;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          *(unsigned_long **)(result + 0x28) =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar4 = (byte)uVar19 & 0x3f;
        puVar1 = (ulong *)(*(long *)(result + 0x28) + (uVar19 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        puVar13[-1] = uVar21;
        *puVar13 = 0;
      }
      uVar19 = uVar19 + 1;
      puVar13 = puVar13 + 2;
    } while (uVar18 != uVar19);
  }
  duckdb::ListVector::Reserve(result,uVar21);
  lVar11 = duckdb::ListVector::GetEntry(result);
  if (uVar18 != 0) {
    lVar11 = *(long *)(lVar11 + 0x20);
    lVar2 = *(long *)(local_110._0_8_ + 8);
    lVar3 = *(long *)local_110._0_8_;
    local_120 = local_100;
    local_128 = local_70;
    local_130 = local_78;
    uVar19 = 0;
    lVar17 = 0;
    do {
      if (lVar2 - lVar3 == 0x68) {
        lVar20 = 0;
      }
      else {
        uVar15 = uVar19;
        if (*(long *)local_110._8_8_ != 0) {
          uVar15 = (ulong)*(uint *)(*(long *)local_110._8_8_ + uVar19 * 4);
        }
        lVar20 = *(long *)(local_100 + uVar15 * 8);
      }
      lVar16 = 1;
      if (2 < (ulong)((lVar2 - lVar3 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
        uVar15 = uVar19;
        if (*local_78 != 0) {
          uVar15 = (ulong)*(uint *)(*local_78 + uVar19 * 4);
        }
        lVar16 = *(long *)(local_70 + uVar15 * 8);
      }
      if (*(long *)(lVar12 + 8 + uVar19 * 0x10) != 0) {
        uVar15 = 0;
        do {
          lVar14 = lVar16;
          if (uVar15 == 0) {
            lVar14 = 0;
          }
          lVar20 = lVar20 + lVar14;
          *(long *)(lVar11 + lVar17 * 8 + uVar15 * 8) = lVar20;
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(ulong *)(uVar19 * 0x10 + lVar12 + 8));
        lVar17 = lVar17 + uVar15;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar18);
  }
  duckdb::ListVector::SetListSize(result,uVar21);
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::Vector::Verify((ulong)result);
  lVar12 = 0xd8;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_110 + lVar12) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_110 + lVar12));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar12) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar12));
    }
    lVar12 = lVar12 + -0x48;
  } while (lVar12 != 0);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}